

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O1

bool __thiscall
anurbs::TypeEntry<anurbs::BrepEdge,_anurbs::Model>::save
          (TypeEntry<anurbs::BrepEdge,_anurbs::Model> *this,Model *model,size_t index,Json *target)

{
  pointer *ppsVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Attributes *this_00;
  BrepEdge *data;
  Model *pMVar3;
  bool bVar4;
  Ref<anurbs::BrepEdge> entry;
  pointer local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pMVar3 = (Model *)&stack0xffffffffffffffd0;
  Model::get<anurbs::BrepEdge>(pMVar3,(size_t)model);
  if (local_30 == (pointer)0x0) {
    bVar4 = true;
  }
  else {
    p_Var2 = local_30[2].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pMVar3 = (Model *)local_30[3].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
    if (pMVar3 != (Model *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppsVar1 = &(pMVar3->m_entries).
                   super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
        UNLOCK();
      }
      else {
        ppsVar1 = &(pMVar3->m_entries).
                   super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
      }
    }
    bVar4 = p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (pMVar3 != (Model *)0x0 && local_30 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar3);
  }
  if (bVar4 == false) {
    pMVar3 = (Model *)&stack0xffffffffffffffd0;
    data = Ref<anurbs::BrepEdge>::operator*((Ref<anurbs::BrepEdge> *)pMVar3);
    BrepEdge::save(pMVar3,data,target);
    this_00 = (Attributes *)
              local_30[3].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_30[4].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    Attributes::
    save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (this_00,model,target);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }